

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

void __thiscall
nuraft::nuraft_global_mgr::commit_worker_loop(nuraft_global_mgr *this,ptr<worker_handle> *handle)

{
  bool bVar1;
  int iVar2;
  pthread_t __target_thread;
  char *__name;
  element_type *peVar3;
  element_type *peVar4;
  __int_type_conflict _Var5;
  __int_type_conflict _Var6;
  element_type *peVar7;
  long lVar8;
  element_type *peVar9;
  long in_RDI;
  bool finished_in_time;
  ptr<logger> *l_;
  iterator entry;
  lock_guard<std::mutex> l;
  ptr<raft_server> target;
  size_t queue_length;
  bool skip_sleeping;
  string thread_name;
  size_t in_stack_00000310;
  raft_server *in_stack_00000318;
  element_type *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffe18;
  unsigned_long in_stack_fffffffffffffe48;
  string local_158 [32];
  __atomic_base<unsigned_long> in_stack_fffffffffffffec8;
  nuraft_global_mgr *in_stack_fffffffffffffed0;
  string local_128 [39];
  undefined1 local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  __shared_ptr *local_a0;
  undefined4 local_94;
  _Self local_90;
  _Self local_88 [2];
  __shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> local_78;
  size_type local_68;
  byte local_5d;
  string local_50 [32];
  string local_30 [48];
  
  std::
  __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x208867);
  std::__cxx11::to_string(in_stack_fffffffffffffe48);
  std::operator+((char *)in_stack_fffffffffffffe18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  std::__cxx11::string::~string(local_50);
  __target_thread = pthread_self();
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np(__target_thread,__name);
  local_5d = 0;
  while( true ) {
    std::
    __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2088e3);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    if ((local_5d & 1) == 0) {
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x208915);
      std::atomic<nuraft::nuraft_global_mgr::worker_handle::status>::operator=
                ((atomic<nuraft::nuraft_global_mgr::worker_handle::status> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (status)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x208930);
      EventAwaiter::wait_ms
                ((EventAwaiter *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (size_t)in_stack_fffffffffffffe08);
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x208950);
      EventAwaiter::reset((EventAwaiter *)0x20895c);
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x20896b);
      std::atomic<nuraft::nuraft_global_mgr::worker_handle::status>::operator=
                ((atomic<nuraft::nuraft_global_mgr::worker_handle::status> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (status)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    }
    std::
    __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2089ca);
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe18);
    if (bVar1) break;
    local_5d = 0;
    local_68 = 0;
    std::shared_ptr<nuraft::raft_server>::shared_ptr
              ((shared_ptr<nuraft::raft_server> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (mutex_type *)in_stack_fffffffffffffe08);
    local_88[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
         ::begin((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                  *)in_stack_fffffffffffffe08);
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
         ::end((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                *)in_stack_fffffffffffffe08);
    bVar1 = std::operator!=(local_88,&local_90);
    if (bVar1) {
      std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator*
                ((_List_iterator<std::shared_ptr<nuraft::raft_server>_> *)0x208a87);
      std::shared_ptr<nuraft::raft_server>::operator=
                ((shared_ptr<nuraft::raft_server> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (shared_ptr<nuraft::raft_server> *)in_stack_fffffffffffffe08);
      std::
      unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::erase((unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
               *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
              (key_type *)in_stack_fffffffffffffe08);
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::pop_front((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      local_68 = std::__cxx11::
                 list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 ::size((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      bVar1 = std::__cxx11::
              list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
              ::empty((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                       *)(in_RDI + 0x88));
      if (!bVar1) {
        local_5d = 1;
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x208b57);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_78);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x208b85);
      local_a0 = (__shared_ptr *)&peVar3->l_;
      local_5d = 1;
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_a0);
      if (bVar1) {
        peVar9 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x208bbe);
        iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
        if (5 < iVar2) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x208bea);
          peVar4 = std::__shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>::get
                             (&local_78);
          msg_if_given_abi_cxx11_((char *)local_c0,"execute commit for %p",peVar4);
          (**(code **)(*(long *)peVar9 + 0x40))
                    (peVar9,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                     ,"commit_worker_loop",0x13a,local_c0);
          std::__cxx11::string::~string(local_c0);
        }
      }
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x208c8a);
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe18);
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool(local_a0);
        if (bVar1) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x208cc5);
          iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
          if (5 < iVar2) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x208cf1);
            msg_if_given_abi_cxx11_((char *)local_e0,"commit of this server has been paused");
            (**(code **)(*(long *)peVar9 + 0x40))
                      (peVar9,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                       ,"commit_worker_loop",0x13d,local_e0);
            std::__cxx11::string::~string(local_e0);
          }
        }
        local_94 = 2;
      }
      else {
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x208d91);
        _Var5 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe18);
        std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x208db2);
        _Var6 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe18);
        if (_Var6 < _Var5) {
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x208ddb);
          peVar7 = std::
                   __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x208dea);
          lVar8 = (**(code **)(*(long *)peVar7 + 0x10))();
          std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x208e18);
          _Var5 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_fffffffffffffe18);
          if (_Var5 < lVar8 - 1U) {
            bVar1 = std::__shared_ptr::operator_cast_to_bool(local_a0);
            if (bVar1) {
              peVar9 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x208e67);
              iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
              if (5 < iVar2) {
                peVar9 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x208e93);
                msg_if_given_abi_cxx11_
                          ((char *)local_100,"execute commit by global worker, queue length %zu",
                           local_68);
                (**(code **)(*(long *)peVar9 + 0x40))
                          (peVar9,6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                           ,"commit_worker_loop",0x14a,local_100);
                std::__cxx11::string::~string(local_100);
              }
            }
            std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x208f2b);
            local_101 = raft_server::commit_in_bg_exec(in_stack_00000318,in_stack_00000310);
            if ((bool)local_101) {
              bVar1 = std::__shared_ptr::operator_cast_to_bool(local_a0);
              if (bVar1) {
                peVar9 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x2090ca);
                in_stack_fffffffffffffe14 = (**(code **)(*(long *)peVar9 + 0x38))();
                if (5 < in_stack_fffffffffffffe14) {
                  in_stack_fffffffffffffe08 =
                       std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2090f6);
                  msg_if_given_abi_cxx11_((char *)local_158,"executed in time");
                  (**(code **)(*(long *)in_stack_fffffffffffffe08 + 0x40))
                            (in_stack_fffffffffffffe08,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                             ,"commit_worker_loop",0x154,local_158);
                  std::__cxx11::string::~string(local_158);
                }
              }
            }
            else {
              bVar1 = std::__shared_ptr::operator_cast_to_bool(local_a0);
              if (bVar1) {
                peVar9 = std::
                         __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)0x208f83);
                iVar2 = (**(code **)(*(long *)peVar9 + 0x38))();
                if (5 < iVar2) {
                  peVar9 = std::
                           __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x208faf);
                  msg_if_given_abi_cxx11_
                            ((char *)local_128,"couldn\'t finish in time (%zu ms), re-push to queue"
                             ,*(undefined8 *)(in_RDI + 0x48));
                  (**(code **)(*(long *)peVar9 + 0x40))
                            (peVar9,6,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                             ,"commit_worker_loop",0x151,local_128);
                  std::__cxx11::string::~string(local_128);
                }
              }
              in_stack_fffffffffffffe18 = (__atomic_base<unsigned_long> *)&stack0xfffffffffffffec8;
              std::shared_ptr<nuraft::raft_server>::shared_ptr
                        ((shared_ptr<nuraft::raft_server> *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         (shared_ptr<nuraft::raft_server> *)in_stack_fffffffffffffe08);
              request_commit(in_stack_fffffffffffffed0,
                             (ptr<raft_server> *)in_stack_fffffffffffffec8._M_i);
              std::shared_ptr<nuraft::raft_server>::~shared_ptr
                        ((shared_ptr<nuraft::raft_server> *)0x20907c);
            }
            local_94 = 0;
            goto LAB_00209181;
          }
        }
        local_94 = 2;
      }
    }
    else {
      local_94 = 2;
    }
LAB_00209181:
    std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x20918e);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void nuraft_global_mgr::commit_worker_loop(ptr<worker_handle> handle) {
    std::string thread_name = "nuraft_g_c" + std::to_string(handle->id_);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    bool skip_sleeping = false;
    while (!handle->stopping_) {
        if (!skip_sleeping) {
            handle->status_ = worker_handle::SLEEPING;
            // Wake up for every 1 second even without invoke, just in case.
            handle->ea_.wait_ms(1000);
            handle->ea_.reset();
            handle->status_ = worker_handle::WORKING;
        }
        if (handle->stopping_) break;

        skip_sleeping = false;
        size_t queue_length = 0;
        ptr<raft_server> target = nullptr;
        {
            std::lock_guard<std::mutex> l(commit_queue_lock_);
            auto entry = commit_queue_.begin();
            if (entry != commit_queue_.end()) {
                target = *entry;
                commit_server_set_.erase(target);
                commit_queue_.pop_front();
                queue_length = commit_queue_.size();
                if (!commit_queue_.empty()) {
                    // Other requests are waiting in the queue,
                    // skip sleeping next time.
                    skip_sleeping = true;
                }
            }
        }
        if (!target) continue;

        ptr<logger>& l_ = target->l_;

        // Whenever we find a task to execute, skip next sleeping for any tasks
        // that can be queued in the meantime.
        skip_sleeping = true;

        p_tr("execute commit for %p", target.get());

        if (target->sm_commit_paused_) {
            p_tr("commit of this server has been paused");
            // Since there can be other Raft server waiting for being served,
            // need to skip nest sleep.
            continue;
        }

        if ( target->quick_commit_index_ <= target->sm_commit_index_ ||
             target->log_store_->next_slot() - 1 <= target->sm_commit_index_ ) {
            // State machine's commit index is large enough not to execute commit
            // (see the comment in `commit_in_bg()`).
            continue;
        }

        p_tr("execute commit by global worker, queue length %zu", queue_length);
        bool finished_in_time =
            target->commit_in_bg_exec(config_.max_scheduling_unit_ms_);
        if (!finished_in_time) {
            // Commit took too long time and aborted in the middle.
            // Put this server to queue again.
            p_tr("couldn't finish in time (%zu ms), re-push to queue",
                 config_.max_scheduling_unit_ms_);
            request_commit(target);
        } else {
            p_tr("executed in time");
        }
    }
}